

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::generateGOST
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  long lVar1;
  ulong uVar2;
  Token *pTVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  char *pcVar9;
  long *plVar10;
  OSAttribute *pOVar11;
  ulong in_RCX;
  undefined8 *puVar12;
  long in_RDX;
  long in_R8;
  ulong in_R9;
  bool bVar13;
  long *in_stack_00000008;
  long *in_stack_00000010;
  char in_stack_00000020;
  char in_stack_00000030;
  OSObject *ospub;
  OSObject *ospriv;
  ByteString param_c;
  ByteString param_b;
  ByteString param_a;
  ByteString value;
  bool bNeverExtractable;
  bool bAlwaysSensitive;
  CK_ULONG ulKeyGenMechanism_1;
  bool bOK_1;
  OSObject *osobject_1;
  CK_ULONG i_2;
  CK_ULONG privateKeyAttribsCount;
  CK_ATTRIBUTE privateKeyAttribs [32];
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  CK_ULONG maxAttribs_1;
  ByteString point;
  CK_ULONG ulKeyGenMechanism;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG publicKeyAttribsCount;
  CK_ATTRIBUTE publicKeyAttribs [32];
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  GOSTPrivateKey *priv;
  GOSTPublicKey *pub;
  AsymmetricAlgorithm *gost;
  AsymmetricKeyPair *kp;
  ECParameters p;
  CK_ULONG i;
  ByteString local_res1158;
  ByteString local_res1190;
  ByteString local_res11b8;
  Token *token;
  Session *session;
  undefined7 in_stack_ffffffffffffedd8;
  undefined1 in_stack_ffffffffffffeddf;
  OSAttribute *in_stack_ffffffffffffede0;
  ECParameters *in_stack_ffffffffffffedf0;
  undefined6 in_stack_ffffffffffffedf8;
  undefined1 in_stack_ffffffffffffedfe;
  undefined1 in_stack_ffffffffffffedff;
  ByteString *in_stack_ffffffffffffee00;
  uint6 in_stack_ffffffffffffee08;
  undefined1 in_stack_ffffffffffffee0e;
  byte in_stack_ffffffffffffee0f;
  OSAttribute *in_stack_ffffffffffffee10;
  byte local_11e2;
  OSAttribute *in_stack_ffffffffffffee20;
  undefined6 in_stack_ffffffffffffee28;
  byte in_stack_ffffffffffffee2e;
  byte in_stack_ffffffffffffee2f;
  undefined7 in_stack_ffffffffffffee38;
  byte in_stack_ffffffffffffee3f;
  HandleManager *in_stack_ffffffffffffee40;
  byte local_117b;
  byte local_116b;
  byte local_115a;
  undefined8 *local_1120;
  byte local_1101;
  byte local_10d2;
  undefined8 *local_1098;
  undefined1 local_1028 [167];
  byte local_f81;
  undefined1 local_f80 [32];
  undefined1 local_ed8 [167];
  byte local_e31;
  undefined1 local_e30 [160];
  undefined1 local_d90 [40];
  undefined1 local_d68 [40];
  undefined1 local_d40 [40];
  undefined1 local_d18 [47];
  byte local_ce9;
  undefined1 local_ce8 [166];
  undefined1 local_c42;
  byte local_c41;
  undefined1 local_c40 [166];
  byte local_b9a;
  byte local_b99;
  undefined1 local_b98 [160];
  undefined8 local_af8;
  byte local_ae9;
  undefined1 local_ae8 [167];
  byte local_a41;
  OSAttribute *local_a40;
  ulong local_a38;
  long local_a30;
  undefined1 *local_a28 [5];
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined1 *local_9f0;
  undefined8 local_9e8;
  undefined8 local_9e0;
  undefined8 *local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8 [43];
  int in_stack_fffffffffffff794;
  CK_OBJECT_HANDLE_PTR in_stack_fffffffffffff798;
  CK_ULONG in_stack_fffffffffffff7a0;
  CK_ATTRIBUTE_PTR in_stack_fffffffffffff7a8;
  CK_SESSION_HANDLE in_stack_fffffffffffff7b0;
  SoftHSM *in_stack_fffffffffffff7b8;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  byte local_709;
  undefined1 local_708 [160];
  undefined1 local_668 [47];
  byte local_639;
  undefined1 local_638 [160];
  undefined8 local_598;
  byte local_589;
  undefined1 local_588 [167];
  byte local_4e1;
  long *local_4e0;
  ulong local_4d8;
  long local_4d0;
  undefined1 *local_4c8 [5];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 *local_478;
  undefined8 local_470;
  undefined8 local_468 [84];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  CK_RV local_1b0;
  long *local_1a8;
  long *local_1a0;
  long *local_198;
  long *local_190;
  undefined1 local_188 [52];
  undefined4 local_154;
  ulong local_d8;
  char local_d0 [56];
  char local_98 [80];
  Token *local_48;
  Session *local_40;
  ulong local_38;
  long local_30;
  ulong local_28;
  long local_20;
  CK_RV local_8;
  
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_40 = (Session *)
             HandleManager::getSession
                       ((HandleManager *)
                        CONCAT17(in_stack_ffffffffffffee2f,
                                 CONCAT16(in_stack_ffffffffffffee2e,in_stack_ffffffffffffee28)),
                        (CK_SESSION_HANDLE)in_stack_ffffffffffffee20);
  if (local_40 == (Session *)0x0) {
    local_8 = 0xb3;
  }
  else {
    local_48 = Session::getToken(local_40);
    if (local_48 == (Token *)0x0) {
      local_8 = 5;
    }
    else {
      ByteString::ByteString((ByteString *)0x183b34);
      ByteString::ByteString((ByteString *)0x183b41);
      ByteString::ByteString((ByteString *)0x183b50);
      for (local_d8 = 0; local_d8 < local_28; local_d8 = local_d8 + 1) {
        lVar1 = *(long *)(local_20 + local_d8 * 0x18);
        if (lVar1 == 0x250) {
          ByteString::ByteString
                    (in_stack_ffffffffffffee00,
                     (uchar *)CONCAT17(in_stack_ffffffffffffedff,
                                       CONCAT16(in_stack_ffffffffffffedfe,in_stack_ffffffffffffedf8)
                                      ),(size_t)in_stack_ffffffffffffedf0);
          ByteString::operator=
                    ((ByteString *)in_stack_ffffffffffffede0,
                     (ByteString *)CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
          ByteString::~ByteString((ByteString *)0x183c50);
        }
        else if (lVar1 == 0x251) {
          ByteString::ByteString
                    (in_stack_ffffffffffffee00,
                     (uchar *)CONCAT17(in_stack_ffffffffffffedff,
                                       CONCAT16(in_stack_ffffffffffffedfe,in_stack_ffffffffffffedf8)
                                      ),(size_t)in_stack_ffffffffffffedf0);
          ByteString::operator=
                    ((ByteString *)in_stack_ffffffffffffede0,
                     (ByteString *)CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
          ByteString::~ByteString((ByteString *)0x183ce5);
        }
        else if (lVar1 == 0x252) {
          ByteString::ByteString
                    (in_stack_ffffffffffffee00,
                     (uchar *)CONCAT17(in_stack_ffffffffffffedff,
                                       CONCAT16(in_stack_ffffffffffffedfe,in_stack_ffffffffffffedf8)
                                      ),(size_t)in_stack_ffffffffffffedf0);
          ByteString::operator=
                    ((ByteString *)in_stack_ffffffffffffede0,
                     (ByteString *)CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
          ByteString::~ByteString((ByteString *)0x183d61);
        }
      }
      sVar7 = ByteString::size((ByteString *)0x183db3);
      if ((sVar7 == 0) || (sVar7 = ByteString::size((ByteString *)0x183dd8), sVar7 == 0)) {
        softHSMLog(6,"generateGOST",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2759,"Missing parameter(s) in pPublicKeyTemplate");
        local_8 = 0xd0;
        local_154 = 1;
      }
      else {
        ECParameters::ECParameters(in_stack_ffffffffffffedf0);
        ECParameters::setEC((ECParameters *)in_stack_ffffffffffffede0,
                            (ByteString *)
                            CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
        local_190 = (long *)0x0;
        pCVar8 = CryptoFactory::i();
        iVar5 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,6);
        local_198 = (long *)CONCAT44(extraout_var,iVar5);
        if (local_198 == (long *)0x0) {
          local_8 = 5;
        }
        else {
          bVar4 = (**(code **)(*local_198 + 0x60))(local_198,&local_190,local_188,0);
          if ((bVar4 & 1) == 0) {
            softHSMLog(3,"generateGOST",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2767,"Could not generate key pair");
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_198);
            local_8 = 5;
          }
          else {
            local_1a0 = (long *)(**(code **)(*local_190 + 0x18))();
            local_1a8 = (long *)(**(code **)(*local_190 + 0x28))();
            local_1b0 = 0;
            local_1b8 = 0x20;
            local_1c0 = 2;
            local_1c8 = 0x30;
            memset(local_4c8,0,0x300);
            local_4c8[1] = (undefined1 *)&local_1c0;
            local_4c8[2] = (undefined1 *)0x8;
            local_4c8[3] = (undefined1 *)0x1;
            local_4c8[4] = &stack0x00000018;
            local_4a0 = 1;
            local_498 = 2;
            local_490 = &stack0x00000020;
            local_488 = 1;
            local_480 = 0x100;
            local_478 = &local_1c8;
            local_470 = 8;
            local_1098 = local_468;
            do {
              local_1098 = local_1098 + 3;
            } while (local_1098 != &local_1c8);
            local_4d0 = 4;
            if (0x1c < local_28) {
              local_1b0 = 0xd1;
            }
            for (local_4d8 = 0; local_4d8 < local_28 && local_1b0 == 0; local_4d8 = local_4d8 + 1) {
              uVar2 = *(ulong *)(local_20 + local_4d8 * 0x18);
              if ((2 < uVar2) && (uVar2 != 0x100)) {
                puVar12 = (undefined8 *)(local_20 + local_4d8 * 0x18);
                local_4c8[local_4d0 * 3] = (undefined1 *)*puVar12;
                local_4c8[local_4d0 * 3 + 1] = (undefined1 *)puVar12[1];
                local_4c8[local_4d0 * 3 + 2] = (undefined1 *)puVar12[2];
                local_4d0 = local_4d0 + 1;
              }
            }
            if (local_1b0 == 0) {
              local_1b0 = CreateObject(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                                       in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                       in_stack_fffffffffffff798,in_stack_fffffffffffff794);
            }
            if (local_1b0 == 0) {
              local_4e0 = (long *)HandleManager::getObject
                                            ((HandleManager *)
                                             CONCAT17(in_stack_ffffffffffffee2f,
                                                      CONCAT16(in_stack_ffffffffffffee2e,
                                                               in_stack_ffffffffffffee28)),
                                             (CK_OBJECT_HANDLE)in_stack_ffffffffffffee20);
              if ((local_4e0 == (long *)0x0) ||
                 (bVar4 = (**(code **)(*local_4e0 + 0x50))(), (bVar4 & 1) == 0)) {
                local_1b0 = 6;
              }
              else {
                bVar4 = (**(code **)(*local_4e0 + 0x58))();
                plVar10 = local_4e0;
                if ((bVar4 & 1) == 0) {
                  local_1b0 = 6;
                }
                else {
                  local_4e1 = 1;
                  local_589 = 0;
                  OSAttribute::OSAttribute
                            (in_stack_ffffffffffffede0,(bool)in_stack_ffffffffffffeddf);
                  local_589 = 1;
                  local_4e1 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,local_588);
                  local_4e1 = local_4e1 & 1;
                  if ((local_589 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                  }
                  plVar10 = local_4e0;
                  local_598 = 0x1040;
                  local_639 = 0;
                  local_10d2 = 0;
                  if ((local_4e1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_ffffffffffffede0,
                               CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                    local_639 = 1;
                    local_10d2 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,local_638);
                  }
                  local_4e1 = local_10d2 & 1;
                  if ((local_639 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                  }
                  ByteString::ByteString((ByteString *)0x1844bd);
                  pTVar3 = local_48;
                  if (in_stack_00000020 == '\0') {
                    (**(code **)(*local_1a0 + 0x40))();
                    ByteString::operator=
                              ((ByteString *)in_stack_ffffffffffffede0,
                               (ByteString *)
                               CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                  }
                  else {
                    pcVar9 = (char *)(**(code **)(*local_1a0 + 0x40))();
                    Token::encrypt(pTVar3,pcVar9,(int)local_668);
                  }
                  plVar10 = local_4e0;
                  local_709 = 0;
                  local_1101 = 0;
                  if ((local_4e1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_ffffffffffffee10,
                               (ByteString *)
                               CONCAT17(in_stack_ffffffffffffee0f,
                                        CONCAT16(in_stack_ffffffffffffee0e,in_stack_ffffffffffffee08
                                                )));
                    local_709 = 1;
                    local_1101 = (**(code **)(*plVar10 + 0x40))(plVar10,0x11,local_708);
                  }
                  local_4e1 = local_1101 & 1;
                  if ((local_709 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                  }
                  if ((local_4e1 & 1) == 0) {
                    (**(code **)(*local_4e0 + 0x68))();
                  }
                  else {
                    local_4e1 = (**(code **)(*local_4e0 + 0x60))();
                    local_4e1 = local_4e1 & 1;
                  }
                  if ((local_4e1 & 1) == 0) {
                    local_1b0 = 6;
                  }
                  ByteString::~ByteString((ByteString *)0x184716);
                }
              }
            }
            if (local_1b0 == 0) {
              local_718 = 0x20;
              local_720 = 3;
              local_728 = 0x30;
              memset(local_a28,0,0x300);
              local_a28[1] = (undefined1 *)&local_720;
              local_a28[2] = (undefined1 *)0x8;
              local_a28[3] = (undefined1 *)0x1;
              local_a28[4] = &stack0x00000028;
              local_a00 = 1;
              local_9f8 = 2;
              local_9f0 = &stack0x00000030;
              local_9e8 = 1;
              local_9e0 = 0x100;
              local_9d8 = &local_728;
              local_9d0 = 8;
              local_1120 = local_9c8;
              do {
                local_1120 = local_1120 + 3;
              } while (local_1120 != &local_728);
              local_a30 = 4;
              if (0x1c < local_38) {
                local_1b0 = 0xd1;
              }
              for (local_a38 = 0; local_a38 < local_38 && local_1b0 == 0; local_a38 = local_a38 + 1)
              {
                uVar2 = *(ulong *)(local_30 + local_a38 * 0x18);
                if ((2 < uVar2) && (uVar2 != 0x100)) {
                  puVar12 = (undefined8 *)(local_30 + local_a38 * 0x18);
                  local_a28[local_a30 * 3] = (undefined1 *)*puVar12;
                  local_a28[local_a30 * 3 + 1] = (undefined1 *)puVar12[1];
                  local_a28[local_a30 * 3 + 2] = (undefined1 *)puVar12[2];
                  local_a30 = local_a30 + 1;
                }
              }
              if (local_1b0 == 0) {
                local_1b0 = CreateObject(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                                         in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                         in_stack_fffffffffffff798,in_stack_fffffffffffff794);
              }
              if (local_1b0 == 0) {
                local_a40 = (OSAttribute *)
                            HandleManager::getObject
                                      ((HandleManager *)
                                       CONCAT17(in_stack_ffffffffffffee2f,
                                                CONCAT16(in_stack_ffffffffffffee2e,
                                                         in_stack_ffffffffffffee28)),
                                       (CK_OBJECT_HANDLE)in_stack_ffffffffffffee20);
                if ((local_a40 == (OSAttribute *)0x0) ||
                   (uVar6 = (*local_a40->_vptr_OSAttribute[10])(), (uVar6 & 1) == 0)) {
                  local_1b0 = 6;
                }
                else {
                  uVar6 = (*local_a40->_vptr_OSAttribute[0xb])(local_a40,1);
                  pOVar11 = local_a40;
                  if ((uVar6 & 1) == 0) {
                    local_1b0 = 6;
                  }
                  else {
                    local_a41 = 1;
                    local_ae9 = 0;
                    OSAttribute::OSAttribute
                              (in_stack_ffffffffffffede0,(bool)in_stack_ffffffffffffeddf);
                    local_ae9 = 1;
                    iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x163,local_ae8);
                    local_a41 = (byte)iVar5 & 1;
                    if ((local_ae9 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    pOVar11 = local_a40;
                    local_af8 = 0x1040;
                    local_b99 = 0;
                    local_115a = 0;
                    if ((local_a41 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffede0,
                                 CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                      local_b99 = 1;
                      iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x166,local_b98);
                      local_115a = (byte)iVar5;
                    }
                    local_a41 = local_115a & 1;
                    if ((local_b99 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    iVar5 = (*local_a40->_vptr_OSAttribute[4])(local_a40,0x103,0);
                    pOVar11 = local_a40;
                    local_b9a = (byte)iVar5 & 1;
                    local_c41 = 0;
                    local_116b = 0;
                    if ((local_a41 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffede0,(bool)in_stack_ffffffffffffeddf);
                      local_c41 = 1;
                      iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x165,local_c40);
                      local_116b = (byte)iVar5;
                    }
                    local_a41 = local_116b & 1;
                    if ((local_c41 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    uVar6 = (*local_a40->_vptr_OSAttribute[4])(local_a40,0x162,0);
                    pOVar11 = local_a40;
                    local_c42 = (uVar6 & 1) == 0;
                    local_ce9 = 0;
                    local_117b = 0;
                    if ((local_a41 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffede0,(bool)in_stack_ffffffffffffeddf);
                      local_ce9 = 1;
                      iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x164,local_ce8);
                      local_117b = (byte)iVar5;
                    }
                    local_a41 = local_117b & 1;
                    if ((local_ce9 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    ByteString::ByteString((ByteString *)0x184dd6);
                    ByteString::ByteString((ByteString *)0x184de5);
                    ByteString::ByteString((ByteString *)0x184df4);
                    ByteString::ByteString((ByteString *)0x184e03);
                    pTVar3 = local_48;
                    if (in_stack_00000030 == '\0') {
                      (**(code **)(*local_1a8 + 0x50))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffede0,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                      in_stack_ffffffffffffee40 =
                           (HandleManager *)(**(code **)(*local_1a8 + 0x58))();
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffede0,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffede0,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                      ByteString::operator=
                                ((ByteString *)in_stack_ffffffffffffede0,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffeddf,in_stack_ffffffffffffedd8));
                    }
                    else {
                      pcVar9 = (char *)(**(code **)(*local_1a8 + 0x50))();
                      Token::encrypt(pTVar3,pcVar9,(int)local_d18);
                      pTVar3 = local_48;
                      pcVar9 = (char *)(**(code **)(*local_1a8 + 0x58))();
                      Token::encrypt(pTVar3,pcVar9,(int)local_d40);
                      Token::encrypt(local_48,local_98,(int)local_d68);
                      Token::encrypt(local_48,local_d0,(int)local_d90);
                    }
                    pOVar11 = local_a40;
                    local_e31 = 0;
                    in_stack_ffffffffffffee3f = 0;
                    if ((local_a41 & 1) != 0) {
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffee10,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffee0f,
                                          CONCAT16(in_stack_ffffffffffffee0e,
                                                   in_stack_ffffffffffffee08)));
                      local_e31 = 1;
                      iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x11,local_e30);
                      in_stack_ffffffffffffee2f = (byte)iVar5;
                      in_stack_ffffffffffffee3f = in_stack_ffffffffffffee2f;
                    }
                    local_a41 = in_stack_ffffffffffffee3f & 1;
                    if ((local_e31 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    bVar13 = (local_a41 & 1) != 0;
                    in_stack_ffffffffffffee2e = 0;
                    if (bVar13) {
                      in_stack_ffffffffffffee20 = local_a40;
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffee10,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffee0f,
                                          CONCAT16(in_stack_ffffffffffffee0e,
                                                   in_stack_ffffffffffffee08)));
                      iVar5 = (*in_stack_ffffffffffffee20->_vptr_OSAttribute[8])
                                        (in_stack_ffffffffffffee20,0x250,local_ed8);
                      in_stack_ffffffffffffee2e = (byte)iVar5;
                    }
                    local_a41 = in_stack_ffffffffffffee2e & 1;
                    if (bVar13) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    local_f81 = 0;
                    local_11e2 = 0;
                    if ((local_a41 & 1) != 0) {
                      in_stack_ffffffffffffee10 = local_a40;
                      OSAttribute::OSAttribute
                                (local_a40,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffee0f,
                                          CONCAT16(in_stack_ffffffffffffee0e,
                                                   in_stack_ffffffffffffee08)));
                      local_f81 = 1;
                      iVar5 = (*in_stack_ffffffffffffee10->_vptr_OSAttribute[8])
                                        (in_stack_ffffffffffffee10,0x251,local_f80);
                      in_stack_ffffffffffffee0f = (byte)iVar5;
                      local_11e2 = in_stack_ffffffffffffee0f;
                    }
                    local_a41 = local_11e2 & 1;
                    if ((local_f81 & 1) != 0) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    bVar13 = (local_a41 & 1) != 0;
                    bVar4 = 0;
                    if (bVar13) {
                      pOVar11 = local_a40;
                      OSAttribute::OSAttribute
                                (in_stack_ffffffffffffee10,
                                 (ByteString *)
                                 CONCAT17(in_stack_ffffffffffffee0f,(uint7)in_stack_ffffffffffffee08
                                         ));
                      iVar5 = (*pOVar11->_vptr_OSAttribute[8])(pOVar11,0x252,local_1028);
                      bVar4 = (byte)iVar5;
                    }
                    local_a41 = bVar4 & 1;
                    if (bVar13) {
                      OSAttribute::~OSAttribute(in_stack_ffffffffffffede0);
                    }
                    if ((local_a41 & 1) == 0) {
                      (*local_a40->_vptr_OSAttribute[0xd])();
                    }
                    else {
                      iVar5 = (*local_a40->_vptr_OSAttribute[0xc])();
                      local_a41 = (byte)iVar5 & 1;
                    }
                    if ((local_a41 & 1) == 0) {
                      local_1b0 = 6;
                    }
                    ByteString::~ByteString((ByteString *)0x185428);
                    ByteString::~ByteString((ByteString *)0x185435);
                    ByteString::~ByteString((ByteString *)0x185442);
                    ByteString::~ByteString((ByteString *)0x18544f);
                  }
                }
              }
            }
            (**(code **)(*local_198 + 0xc0))(local_198,local_190);
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_198);
            if (local_1b0 != 0) {
              if (*in_stack_00000010 != 0) {
                plVar10 = (long *)HandleManager::getObject
                                            ((HandleManager *)
                                             CONCAT17(in_stack_ffffffffffffee2f,
                                                      CONCAT16(in_stack_ffffffffffffee2e,
                                                               in_stack_ffffffffffffee28)),
                                             (CK_OBJECT_HANDLE)in_stack_ffffffffffffee20);
                HandleManager::destroyObject
                          (in_stack_ffffffffffffee40,
                           CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38));
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x70))();
                }
                *in_stack_00000010 = 0;
              }
              if (*in_stack_00000008 != 0) {
                pOVar11 = (OSAttribute *)
                          HandleManager::getObject
                                    ((HandleManager *)
                                     CONCAT17(in_stack_ffffffffffffee2f,
                                              CONCAT16(in_stack_ffffffffffffee2e,
                                                       in_stack_ffffffffffffee28)),
                                     (CK_OBJECT_HANDLE)in_stack_ffffffffffffee20);
                in_stack_ffffffffffffede0 = pOVar11;
                HandleManager::destroyObject
                          (in_stack_ffffffffffffee40,
                           CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38));
                if (pOVar11 != (OSAttribute *)0x0) {
                  (*(((AsymmetricParameters *)&pOVar11->_vptr_OSAttribute)->super_Serialisable).
                    _vptr_Serialisable[0xe])();
                }
                *in_stack_00000008 = 0;
              }
            }
            local_8 = local_1b0;
          }
        }
        local_154 = 1;
        ECParameters::~ECParameters((ECParameters *)in_stack_ffffffffffffede0);
      }
      ByteString::~ByteString((ByteString *)0x18564b);
      ByteString::~ByteString((ByteString *)0x185658);
      ByteString::~ByteString((ByteString *)0x185665);
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::generateGOST
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information
	ByteString param_3410;
	ByteString param_3411;
	ByteString param_28147;
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_GOSTR3410_PARAMS:
				param_3410 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOSTR3411_PARAMS:
				param_3411 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOST28147_PARAMS:
				param_28147 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// The parameters must be specified to be able to generate a key pair.
	if (param_3410.size() == 0 || param_3411.size() == 0) {
		INFO_MSG("Missing parameter(s) in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	ECParameters p;
	p.setEC(param_3410);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* gost = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
	if (gost == NULL) return CKR_GENERAL_ERROR;
	if (!gost->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);
		return CKR_GENERAL_ERROR;
	}

	GOSTPublicKey* pub = (GOSTPublicKey*) kp->getPublicKey();
	GOSTPrivateKey* priv = (GOSTPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// EC Public Key Attributes
				ByteString point;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getQ(), point);
				}
				else
				{
					point = pub->getQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, point);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// GOST Private Key Attributes
				ByteString value;
				ByteString param_a;
				ByteString param_b;
				ByteString param_c;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getD(), value);
					token->encrypt(priv->getEC(), param_a);
					token->encrypt(param_3411, param_b);
					token->encrypt(param_28147, param_c);
				}
				else
				{
					value = priv->getD();
					param_a = priv->getEC();
					param_b = param_3411;
					param_c = param_28147;
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3410_PARAMS, param_a);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3411_PARAMS, param_b);
				bOK = bOK && osobject->setAttribute(CKA_GOST28147_PARAMS, param_c);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				  rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	gost->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}